

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkDupAttrs(Cba_Ntk_t *pNew,Cba_Ntk_t *p)

{
  int iVar1;
  Vec_Vec_t *local_b0;
  int local_1c;
  int iObj;
  int i;
  Cba_Ntk_t *p_local;
  Cba_Ntk_t *pNew_local;
  
  iVar1 = Vec_IntSize(&pNew->vOrder);
  if (iVar1 != 0) {
    __assert_fail("Vec_IntSize(&pNew->vOrder) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cba.h"
                  ,0x2d2,"void Cba_NtkDupAttrs(Cba_Ntk_t *, Cba_Ntk_t *)");
  }
  for (local_1c = 0; iVar1 = Cba_NtkPioOrderNum(p), local_1c < iVar1; local_1c = local_1c + 1) {
    iVar1 = Cba_NtkPioOrder(p,local_1c);
    iVar1 = Cba_ObjCopy(p,iVar1);
    Vec_IntPush(&pNew->vOrder,iVar1);
  }
  iVar1 = Cba_NtkObjNum(pNew);
  Vec_IntRemapArray(&p->vObjCopy,&p->vObjFunc,&pNew->vObjFunc,iVar1 + 1);
  iVar1 = Cba_NtkObjNum(pNew);
  Vec_IntRemapArray(&p->vObjCopy,&p->vObjName,&pNew->vObjName,iVar1 + 1);
  iVar1 = Cba_NtkObjNum(pNew);
  Vec_IntRemapArray(&p->vObjCopy,&p->vObjAttr,&pNew->vObjAttr,iVar1 + 1);
  iVar1 = Cba_NtkFonNum(pNew);
  Vec_IntRemapArray(&p->vFonCopy,&p->vFonName,&pNew->vFonName,iVar1 + 1);
  iVar1 = Cba_NtkFonNum(pNew);
  Vec_IntRemapArray(&p->vFonCopy,&p->vFonRange,&pNew->vFonRange,iVar1 + 1);
  Vec_IntAppend(&pNew->vAttrSto,&p->vAttrSto);
  if (p->vOther == (Vec_Ptr_t *)0x0) {
    local_b0 = (Vec_Vec_t *)0x0;
  }
  else {
    local_b0 = Vec_VecDup((Vec_Vec_t *)p->vOther);
  }
  pNew->vOther = (Vec_Ptr_t *)local_b0;
  return;
}

Assistant:

static inline void Cba_NtkDupAttrs( Cba_Ntk_t * pNew, Cba_Ntk_t * p )
{
    int i, iObj;
    assert( Vec_IntSize(&pNew->vOrder) == 0 );
    Cba_NtkForEachPioOrder( p, iObj, i )
        Vec_IntPush( &pNew->vOrder, Cba_ObjCopy(p, iObj) );
//    Vec_IntRemapArray( &p->vObjCopy, &p->vOrder,    &pNew->vOrder,    Cba_NtkPioOrderNum(p) );
//    Vec_IntRemapArray( &p->vObjCopy, &p->vSeq,      &pNew->vSeq,      Cba_NtkBoxSeqNum(p) );
    // transfer object attributes
    Vec_IntRemapArray( &p->vObjCopy, &p->vObjFunc,  &pNew->vObjFunc,  Cba_NtkObjNum(pNew) + 1 );
    Vec_IntRemapArray( &p->vObjCopy, &p->vObjName,  &pNew->vObjName,  Cba_NtkObjNum(pNew) + 1 );
    Vec_IntRemapArray( &p->vObjCopy, &p->vObjAttr,  &pNew->vObjAttr,  Cba_NtkObjNum(pNew) + 1 );
    // transfer fon attributes
    Vec_IntRemapArray( &p->vFonCopy, &p->vFonName,  &pNew->vFonName,  Cba_NtkFonNum(pNew) + 1 );
    Vec_IntRemapArray( &p->vFonCopy, &p->vFonRange, &pNew->vFonRange, Cba_NtkFonNum(pNew) + 1 );
    // duplicate attributes
    Vec_IntAppend( &pNew->vAttrSto, &p->vAttrSto );
    pNew->vOther = p->vOther ? (Vec_Ptr_t *)Vec_VecDup( (Vec_Vec_t *)p->vOther ) : NULL;
}